

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::makeReturn(Builder *this,bool implicit,Id retVal)

{
  Block *this_00;
  Instruction *this_01;
  _Head_base<0UL,_spv::Instruction_*,_false> *inst;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  
  if (retVal == 0) {
    this_00 = this->buildPoint;
    local_30._M_head_impl = (Instruction *)dxil_spv::allocate_in_thread(0x38);
    (local_30._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
    (local_30._M_head_impl)->resultId = 0;
    (local_30._M_head_impl)->typeId = 0;
    (local_30._M_head_impl)->opCode = OpReturn;
    ((local_30._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_30._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_30._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_30._M_head_impl)->block = (Block *)0x0;
    inst = &local_30;
    Block::addInstruction
              (this_00,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)inst)
    ;
    if (local_30._M_head_impl != (Instruction *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Instruction[1])();
    }
    local_30._M_head_impl = (Instruction *)0x0;
  }
  else {
    this_01 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
    this_01->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
    this_01->resultId = 0;
    this_01->typeId = 0;
    this_01->opCode = OpReturnValue;
    (this_01->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01->block = (Block *)0x0;
    Instruction::addIdOperand(this_01,retVal);
    inst = &local_28;
    local_28._M_head_impl = this_01;
    Block::addInstruction
              (this->buildPoint,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)inst);
    if (local_28._M_head_impl != (Instruction *)0x0) {
      (*(local_28._M_head_impl)->_vptr_Instruction[1])();
    }
    local_28._M_head_impl = (Instruction *)0x0;
  }
  if (!implicit) {
    createAndSetNoPredecessorBlock(this,(char *)inst);
  }
  return;
}

Assistant:

void Builder::makeReturn(bool implicit, Id retVal)
{
    if (retVal) {
        Instruction* inst = new Instruction(NoResult, NoType, OpReturnValue);
        inst->addIdOperand(retVal);
        buildPoint->addInstruction(std::unique_ptr<Instruction>(inst));
    } else
        buildPoint->addInstruction(std::unique_ptr<Instruction>(new Instruction(NoResult, NoType, OpReturn)));

    if (! implicit)
        createAndSetNoPredecessorBlock("post-return");
}